

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeSPRRegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,void *Decoder)

{
  uint in_ESI;
  MCInst *in_RDI;
  uint Register;
  DecodeStatus local_4;
  
  if (in_ESI < 0x20) {
    MCOperand_CreateReg0(in_RDI,(uint)SPRDecoderTable[in_ESI]);
    local_4 = MCDisassembler_Success;
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeSPRRegisterClass(MCInst *Inst, unsigned RegNo,
		uint64_t Address, const void *Decoder)
{
	unsigned Register;
	if (RegNo > 31)
		return MCDisassembler_Fail;

	Register = SPRDecoderTable[RegNo];
	MCOperand_CreateReg0(Inst, Register);
	return MCDisassembler_Success;
}